

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UnicodeString *
icu_63::TimeZoneFormat::expandOffsetPattern
          (UnicodeString *offsetHM,UnicodeString *result,UErrorCode *status)

{
  short sVar1;
  int32_t len;
  int32_t iVar2;
  undefined4 length;
  uint start;
  uint uVar3;
  UnicodeString sep;
  UnicodeString local_b0;
  undefined6 *local_70;
  UnicodeString local_60;
  
  UnicodeString::setToBogus(result);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (offsetHM->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar3 = (offsetHM->fUnion).fFields.fLength;
    }
    else {
      uVar3 = (int)sVar1 >> 5;
    }
    start = (int)uVar3 >> 0x1f & uVar3;
    len = UnicodeString::indexOf(offsetHM,L"mm",0,2,start,uVar3 - start);
    if (len < 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258
      ;
      local_60.fUnion.fStackFields.fLengthAndFlags = 2;
      UnicodeString::tempSubString(&local_b0,offsetHM,0,len);
      length = local_b0.fUnion.fFields.fLength;
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        length = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar2 = UnicodeString::doLastIndexOf(&local_b0,L'H',0,length);
      UnicodeString::~UnicodeString(&local_b0);
      if (-1 < iVar2) {
        UnicodeString::tempSubString(&local_b0,offsetHM,iVar2 + 1,len - (iVar2 + 1));
        UnicodeString::moveFrom(&local_60,&local_b0);
        UnicodeString::~UnicodeString(&local_b0);
      }
      UnicodeString::tempSubString(&local_b0,offsetHM,0,len + 2);
      UnicodeString::copyFrom(result,&local_b0,'\0');
      UnicodeString::~UnicodeString(&local_b0);
      if (-1 < local_60.fUnion.fStackFields.fLengthAndFlags) {
        local_60.fUnion.fFields.fLength = (int)local_60.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doAppend(result,&local_60,0,local_60.fUnion.fFields.fLength);
      UnicodeString::doAppend(result,L"ss",0,-1);
      local_70 = &DEFAULT_GMT_OFFSET_SECOND_PATTERN;
      UnicodeString::tempSubString(&local_b0,offsetHM,len + 2,0x7fffffff);
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        local_b0.fUnion.fFields.fLength = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doAppend(result,&local_b0,0,local_b0.fUnion.fFields.fLength);
      UnicodeString::~UnicodeString(&local_b0);
      UnicodeString::~UnicodeString(&local_60);
    }
  }
  return result;
}

Assistant:

UnicodeString&
TimeZoneFormat::expandOffsetPattern(const UnicodeString& offsetHM, UnicodeString& result, UErrorCode& status) {
    result.setToBogus();
    if (U_FAILURE(status)) {
        return result;
    }
    U_ASSERT(u_strlen(DEFAULT_GMT_OFFSET_MINUTE_PATTERN) == 2);

    int32_t idx_mm = offsetHM.indexOf(DEFAULT_GMT_OFFSET_MINUTE_PATTERN, 2, 0);
    if (idx_mm < 0) {
        // Bad time zone hour pattern data
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    UnicodeString sep;
    int32_t idx_H = offsetHM.tempSubString(0, idx_mm).lastIndexOf((UChar)0x0048 /* H */);
    if (idx_H >= 0) {
        sep = offsetHM.tempSubString(idx_H + 1, idx_mm - (idx_H + 1));
    }
    result.setTo(offsetHM.tempSubString(0, idx_mm + 2));
    result.append(sep);
    result.append(DEFAULT_GMT_OFFSET_SECOND_PATTERN, -1);
    result.append(offsetHM.tempSubString(idx_mm + 2));
    return result;
}